

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::CheckRuleHashes(cmGlobalGenerator *this,string *pfile,string *home)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  string fpath;
  string line;
  string fname;
  RuleHash hash;
  ifstream fin;
  string local_2c0;
  string *local_2a0;
  string local_298;
  string local_278;
  size_type local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 local_238 [520];
  
  std::ifstream::ifstream(local_238,(pfile->_M_dataplus)._M_p,_S_in);
  if (((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 5) == 0) {
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    local_298._M_string_length = 0;
    local_298.field_2._M_local_buf[0] = '\0';
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    local_278._M_string_length = 0;
    local_278.field_2._M_local_buf[0] = '\0';
    local_2a0 = home;
    while( true ) {
      bVar1 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)local_238,&local_298,(bool *)0x0,0xffffffffffffffff);
      if (!bVar1) break;
      if ((0x21 < local_298._M_string_length) && (*local_298._M_dataplus._M_p != '#')) {
        std::__cxx11::string::substr((ulong)&local_2c0,(ulong)&local_298);
        std::__cxx11::string::operator=((string *)&local_278,(string *)&local_2c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
                ::find(&(this->RuleHashes)._M_t,&local_278);
        if ((_Rb_tree_header *)iVar3._M_node ==
            &(this->RuleHashes)._M_t._M_impl.super__Rb_tree_header) {
          cmsys::SystemTools::CollapseFullPath(&local_2c0,&local_278,local_2a0);
          bVar1 = cmsys::SystemTools::FileExists(&local_2c0);
          if (bVar1) {
            local_258 = *(size_type *)local_298._M_dataplus._M_p;
            uStack_250 = *(undefined8 *)(local_298._M_dataplus._M_p + 8);
            local_248 = *(undefined8 *)(local_298._M_dataplus._M_p + 0x10);
            uStack_240 = *(undefined8 *)(local_298._M_dataplus._M_p + 0x18);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
                     ::operator[](&this->RuleHashes,&local_278);
            *(undefined8 *)(pmVar4->Data + 0x10) = local_248;
            *(undefined8 *)(pmVar4->Data + 0x18) = uStack_240;
            *(size_type *)pmVar4->Data = local_258;
            *(undefined8 *)(pmVar4->Data + 8) = uStack_250;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar2 = strncmp(local_298._M_dataplus._M_p,(char *)(iVar3._M_node + 2),0x20);
          if (iVar2 != 0) {
            cmsys::SystemTools::CollapseFullPath(&local_2c0,&local_278,local_2a0);
            std::__cxx11::string::operator=((string *)&local_278,(string *)&local_2c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
              operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1
                             );
            }
            cmsys::SystemTools::RemoveFile(&local_278);
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,
                      CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                               local_278.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,
                      CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                               local_298.field_2._M_local_buf[0]) + 1);
    }
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void cmGlobalGenerator::CheckRuleHashes(std::string const& pfile,
                                        std::string const& home)
{
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(pfile.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(pfile.c_str());
#endif
  if (!fin) {
    return;
  }
  std::string line;
  std::string fname;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    // Line format is a 32-byte hex string followed by a space
    // followed by a file name (with no escaping).

    // Skip blank and comment lines.
    if (line.size() < 34 || line[0] == '#') {
      continue;
    }

    // Get the filename.
    fname = line.substr(33);

    // Look for a hash for this file's rule.
    auto const rhi = this->RuleHashes.find(fname);
    if (rhi != this->RuleHashes.end()) {
      // Compare the rule hash in the file to that we were given.
      if (strncmp(line.c_str(), rhi->second.Data, 32) != 0) {
        // The rule has changed.  Delete the output so it will be
        // built again.
        fname = cmSystemTools::CollapseFullPath(fname, home);
        cmSystemTools::RemoveFile(fname);
      }
    } else {
      // We have no hash for a rule previously listed.  This may be a
      // case where a user has turned off a build option and might
      // want to turn it back on later, so do not delete the file.
      // Instead, we keep the rule hash as long as the file exists so
      // that if the feature is turned back on and the rule has
      // changed the file is still rebuilt.
      std::string fpath = cmSystemTools::CollapseFullPath(fname, home);
      if (cmSystemTools::FileExists(fpath)) {
        RuleHash hash;
        memcpy(hash.Data, line.c_str(), 32);
        this->RuleHashes[fname] = hash;
      }
    }
  }
}